

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void cfd::core::ConvertFromUniValue<int>(int *value,UniValue *json_value)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  UniValue *this;
  CfdException *this_00;
  string *psVar4;
  undefined8 uVar5;
  UniValue *in_RSI;
  undefined4 *in_RDI;
  int64_t minimum;
  int64_t maximum;
  int64_t num;
  bool is_digits_only;
  iterator begin_pos;
  string str;
  UniValue json_value_copy;
  UniValue *in_stack_fffffffffffffd78;
  UniValue *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd98;
  allocator *paVar6;
  CfdError error_code;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda0;
  VType in_stack_fffffffffffffdac;
  UniValue *in_stack_fffffffffffffdb0;
  allocator local_221;
  string local_220 [32];
  CfdSourceLocation local_200;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [32];
  char *local_1c0;
  undefined4 local_1b8;
  char *local_1b0;
  long local_1a8;
  long local_1a0;
  CfdException *local_198;
  UniValue local_190;
  undefined8 local_138;
  char *local_130;
  undefined1 local_121;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  allocator local_111;
  string local_110 [32];
  UniValue local_f0;
  string local_88 [32];
  UniValue local_68;
  UniValue *local_10;
  undefined4 *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  UniValue::UniValue((UniValue *)in_stack_fffffffffffffda0._M_current,
                     (UniValue *)in_stack_fffffffffffffd98._M_current);
  bVar1 = UniValue::isStr(&local_68);
  if (bVar1) {
    psVar4 = UniValue::get_str_abi_cxx11_(local_10);
    ::std::__cxx11::string::string(local_88,(string *)psVar4);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_110,"0",&local_111);
      UniValue::UniValue(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
                         (string *)in_stack_fffffffffffffda0._M_current);
      UniValue::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      UniValue::~UniValue(&local_f0);
      ::std::__cxx11::string::~string(local_110);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    else {
      local_120._M_current = (char *)::std::__cxx11::string::begin();
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_120);
      if (*pcVar3 == '-') {
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_120);
      }
      local_130 = local_120._M_current;
      local_138 = ::std::__cxx11::string::end();
      local_121 = ::std::
                  all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                             (_func_int_int *)in_stack_fffffffffffffd90);
      if ((bool)local_121) {
        this = (UniValue *)UniValue::get_str_abi_cxx11_(local_10);
        UniValue::UniValue(this,in_stack_fffffffffffffdac,
                           (string *)in_stack_fffffffffffffda0._M_current);
        UniValue::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        UniValue::~UniValue(&local_190);
      }
    }
    ::std::__cxx11::string::~string(local_88);
  }
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd98._M_current >> 0x20);
  bVar1 = UniValue::isNum(&local_68);
  if (bVar1) {
    this_00 = (CfdException *)UniValue::get_int64(&local_68);
    local_198 = this_00;
    iVar2 = ::std::numeric_limits<int>::max();
    local_1a0 = (long)iVar2;
    iVar2 = ::std::numeric_limits<int>::min();
    local_1a8 = (long)iVar2;
    if (((long)local_198 <= local_1a0) && (local_1a8 <= (long)local_198)) {
      *local_8 = (int)local_198;
      UniValue::~UniValue(&local_68);
      return;
    }
    local_1c0 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
                        ,0x2f);
    local_1c0 = local_1c0 + 1;
    local_1b8 = 0xf8;
    local_1b0 = "ConvertFromUniValue";
    logger::warn<long_const&>
              ((CfdSourceLocation *)in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
               (long *)0x6c3952);
    local_1e2 = 1;
    psVar4 = (string *)__cxa_allocate_exception(0x30);
    paVar6 = &local_1e1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1e0,"Json value convert error. Value out of range.",paVar6)
    ;
    CfdException::CfdException(this_00,(CfdError)((ulong)paVar6 >> 0x20),psVar4);
    local_1e2 = 0;
    __cxa_throw(psVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_200.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/../include/cfdcore/cfdcore_json_mapping_base.h"
               ,0x2f);
  local_200.filename = local_200.filename + 1;
  local_200.line = 0x100;
  local_200.funcname = "ConvertFromUniValue";
  logger::warn<>(&local_200,"Invalid json format.");
  uVar5 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_220,"Json value convert error. Invalid json format.",&local_221);
  CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffffda0._M_current,error_code,
             in_stack_fffffffffffffd90);
  __cxa_throw(uVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    auto str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}